

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall Scope::SetIsObject(Scope *this)

{
  FuncInfo *this_00;
  Symbol *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Symbol **ppSVar5;
  Scope *this_01;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    do {
      if ((*(ushort *)&this->field_0x44 & 2) != 0) {
        return;
      }
      *(ushort *)&this->field_0x44 = *(ushort *)&this->field_0x44 | 2;
      this_00 = this->func;
      if (this_00 == (FuncInfo *)0x0) {
        return;
      }
      if ((this_00->field_0xb5 & 0x20) == 0) {
        ppSVar5 = &this->m_symList;
        do {
          pSVar1 = *ppSVar5;
          if (pSVar1 == (Symbol *)0x0) goto LAB_007dc252;
          ppSVar5 = &pSVar1->next;
        } while (pSVar1->hasFuncAssignment != true);
        FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"DelayedObjectScopeAssignment");
      }
LAB_007dc252:
      if ((this->scopeType != ScopeType_FunctionBody) && (this->scopeType != ScopeType_Parameter)) {
        return;
      }
      if ((this_00->field_0xb5 & 0x80) != 0) {
        return;
      }
      this_01 = this_00->paramScope;
      if (this_01 == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                           ,0x4f,"(funcInfo->paramScope)","funcInfo->paramScope");
        if (!bVar3) goto LAB_007dc316;
        *puVar4 = 0;
        this_01 = this_00->paramScope;
      }
      SetIsObject(this_01);
      this = this_00->bodyScope;
    } while (this != (Scope *)0x0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                       ,0x52,"(funcInfo->bodyScope)","funcInfo->bodyScope");
    if (!bVar3) {
LAB_007dc316:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this = this_00->bodyScope;
  } while( true );
}

Assistant:

void Scope::SetIsObject()
{
    if (this->isObject)
    {
        return;
    }

    this->isObject = true;

    // We might set the scope to be object after we have process the symbol
    // (e.g. "With" scope referencing a symbol in an outer scope).
    // If we have func assignment, we need to mark the function to not do stack nested function
    // as these are now assigned to a scope object.
    FuncInfo * funcInfo = this->GetFunc();
    if (funcInfo && !funcInfo->HasMaybeEscapedNestedFunc())
    {
        this->ForEachSymbolUntil([funcInfo](Symbol * const sym)
        {
            if (sym->GetHasFuncAssignment())
            {
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DelayedObjectScopeAssignment")));
                return true;
            }
            return false;
        });
    }

    // If the scope is split (there exists a body and param scope), then it is required that the
    // body and param scope are marked as both requiring either a scope object or a scope slot.
    if ((this->GetScopeType() == ScopeType_FunctionBody || this->GetScopeType() == ScopeType_Parameter)
        && funcInfo && !funcInfo->IsBodyAndParamScopeMerged())
    {
        // The scope is split and one of the scopes (param or body) is being set 
        // as an object, therefore set both the param and body scopes as objects.
        Assert(funcInfo->paramScope);
        funcInfo->paramScope->SetIsObject();

        Assert(funcInfo->bodyScope);
        funcInfo->bodyScope->SetIsObject();
    }
}